

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk3c(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk3c *peVar5;
  envy_bios_power_unk3c_entry *peVar6;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk3c *unk3c;
  envy_bios *bios_local;
  
  peVar5 = &(bios->power).unk3c;
  if (peVar5->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar5->offset,&(bios->power).unk3c.version);
    uVar1 = (bios->power).unk3c.version;
    if ((uVar1 == '\x10') || (uVar1 == ' ')) {
      iVar2 = bios_u8(bios,peVar5->offset + 1,&(bios->power).unk3c.hlen);
      iVar3 = bios_u8(bios,peVar5->offset + 2,&(bios->power).unk3c.rlen);
      iVar4 = bios_u8(bios,peVar5->offset + 3,&(bios->power).unk3c.entriesnum);
      (bios->power).unk3c.valid = ((iVar4 != 0 || (iVar3 != 0 || iVar2 != 0)) ^ 0xffU) & 1;
      peVar6 = (envy_bios_power_unk3c_entry *)malloc((ulong)(bios->power).unk3c.entriesnum << 2);
      (bios->power).unk3c.entries = peVar6;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk3c.entriesnum; data = data + 1) {
        (bios->power).unk3c.entries[(int)data].offset =
             peVar5->offset + (uint)(bios->power).unk3c.hlen + data * (bios->power).unk3c.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown POWER TOPOLOGY table version 0x%x\n",
              (ulong)(bios->power).unk3c.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk3c(struct envy_bios *bios) {
	struct envy_bios_power_unk3c *unk3c = &bios->power.unk3c;
	int i, err = 0;

	if (!unk3c->offset)
		return -EINVAL;

	bios_u8(bios, unk3c->offset + 0x0, &unk3c->version);
	switch(unk3c->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk3c->offset + 0x1, &unk3c->hlen);
		err |= bios_u8(bios, unk3c->offset + 0x2, &unk3c->rlen);
		err |= bios_u8(bios, unk3c->offset + 0x3, &unk3c->entriesnum);
		unk3c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER TOPOLOGY table version 0x%x\n", unk3c->version);
		return -EINVAL;
	};

	err = 0;
	unk3c->entries = malloc(unk3c->entriesnum * sizeof(struct envy_bios_power_unk3c_entry));
	for (i = 0; i < unk3c->entriesnum; i++) {
		uint32_t data = unk3c->offset + unk3c->hlen + i * unk3c->rlen;

		unk3c->entries[i].offset = data;
	}

	return 0;
}